

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Axis.cpp
# Opt level: O0

TransformDerivative * __thiscall
iDynTree::Axis::getRotationTransformDerivative(Axis *this,double theta)

{
  VectorFixSize<3U> *pVVar1;
  double *pdVar2;
  Axis *in_RSI;
  TransformDerivative *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  Vector3 translationPositionDerivative;
  double c;
  double b;
  double a;
  double w2;
  double w;
  double v2;
  double v;
  double u2;
  double u;
  double sint;
  double cost;
  TransformDerivative *derivative_nonRotated_T_rotated;
  Matrix3x3 *in_stack_fffffffffffffe98;
  TransformDerivative *in_stack_fffffffffffffea0;
  VectorFixSize<3U> local_e8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  undefined1 local_19;
  Axis *direction;
  
  local_19 = 0;
  direction = in_RSI;
  TransformDerivative::TransformDerivative(in_stack_fffffffffffffea0);
  getDirection(in_RSI);
  Rotation::RotAxisDerivative(&direction->direction,in_XMM0_Qa);
  TransformDerivative::setRotationDerivative(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  local_80 = cos(in_XMM0_Qa);
  local_88 = sin(in_XMM0_Qa);
  pVVar1 = &getDirection(in_RSI)->super_Vector3;
  local_90 = VectorFixSize<3U>::operator()(pVVar1,0);
  local_98 = local_90 * local_90;
  pVVar1 = &getDirection(in_RSI)->super_Vector3;
  local_a0 = VectorFixSize<3U>::operator()(pVVar1,1);
  local_a8 = local_a0 * local_a0;
  pVVar1 = &getDirection(in_RSI)->super_Vector3;
  local_b0 = VectorFixSize<3U>::operator()(pVVar1,2);
  local_b8 = local_b0 * local_b0;
  pVVar1 = &getOrigin(in_RSI)->super_Vector3;
  local_c0 = VectorFixSize<3U>::operator()(pVVar1,0);
  pVVar1 = &getOrigin(in_RSI)->super_Vector3;
  local_c8 = VectorFixSize<3U>::operator()(pVVar1,1);
  pVVar1 = &getOrigin(in_RSI)->super_Vector3;
  local_d0 = VectorFixSize<3U>::operator()(pVVar1,2);
  VectorFixSize<3U>::VectorFixSize(&local_e8);
  dVar4 = (local_c8 * local_b0 - local_d0 * local_a0) * local_80;
  dVar3 = (local_c0 * (local_a8 + local_b8) - local_90 * (local_c8 * local_a0 + local_d0 * local_b0)
          ) * local_88;
  pdVar2 = VectorFixSize<3U>::operator()(&local_e8,0);
  *pdVar2 = dVar3 + dVar4;
  dVar4 = (local_d0 * local_90 - local_c0 * local_b0) * local_80;
  dVar3 = (local_c8 * (local_98 + local_b8) - local_a0 * (local_c0 * local_90 + local_d0 * local_b0)
          ) * local_88;
  pdVar2 = VectorFixSize<3U>::operator()(&local_e8,1);
  *pdVar2 = dVar3 + dVar4;
  dVar3 = (local_d0 * (local_98 + local_a8) - local_b0 * (local_c0 * local_90 + local_c8 * local_a0)
          ) * local_88 + (local_c0 * local_a0 - local_c8 * local_90) * local_80;
  pdVar2 = VectorFixSize<3U>::operator()(&local_e8,2);
  *pdVar2 = dVar3;
  TransformDerivative::setPositionDerivative(in_RDI,&local_e8);
  return in_RDI;
}

Assistant:

TransformDerivative Axis::getRotationTransformDerivative(const double theta) const
    {
        // Formula for rotation around and arbitrary axis given by
        // http://inside.mines.edu/fs_home/gmurray/ArbitraryAxisRotation/
        // In this function we
        TransformDerivative derivative_nonRotated_T_rotated;

        // rotation
        derivative_nonRotated_T_rotated.setRotationDerivative(Rotation::RotAxisDerivative(this->getDirection(),theta));

        // translation
        double cost = cos(theta);
        double sint = sin(theta);
        double u   = this->getDirection()(0);
        double u2  = u*u;
        double v   = this->getDirection()(1);
        double v2  = v*v;
        double w   = this->getDirection()(2);
        double w2  = w*w;
        double a    = this->getOrigin()(0);
        double b    = this->getOrigin()(1);
        double c    = this->getOrigin()(2);

        Vector3 translationPositionDerivative;
        translationPositionDerivative(0) =
            (a*(v2+w2) - u*(b*v+c*w))*(sint) + (b*w-c*v)*cost;
        translationPositionDerivative(1) =
            (b*(u2+w2) - v*(a*u+c*w))*(sint) + (c*u-a*w)*cost;
        translationPositionDerivative(2) =
            (c*(u2+v2) - w*(a*u+b*v))*(sint) + (a*v-b*u)*cost;

        derivative_nonRotated_T_rotated.setPositionDerivative(translationPositionDerivative);

        return derivative_nonRotated_T_rotated;
    }